

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall tinyxml2::XMLElement::GetText(XMLElement *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar2;
  XMLNode *pXVar3;
  
  pXVar3 = (this->super_XMLNode)._firstChild;
  while( true ) {
    if (pXVar3 == (XMLNode *)0x0) {
      return (char *)0x0;
    }
    iVar1 = (*pXVar3->_vptr_XMLNode[8])(pXVar3);
    if (CONCAT44(extraout_var,iVar1) == 0) break;
    pXVar3 = pXVar3->_next;
  }
  iVar1 = (*pXVar3->_vptr_XMLNode[7])(pXVar3);
  if (CONCAT44(extraout_var_00,iVar1) == 0) {
    return (char *)0x0;
  }
  iVar1 = (*pXVar3->_vptr_XMLNode[9])(pXVar3);
  if (CONCAT44(extraout_var_01,iVar1) != 0) {
    return (char *)0x0;
  }
  pcVar2 = StrPair::GetStr(&pXVar3->_value);
  return pcVar2;
}

Assistant:

const char* XMLElement::GetText() const
{
    /* skip comment node */
    const XMLNode* node = FirstChild();
    while (node) {
        if (node->ToComment()) {
            node = node->NextSibling();
            continue;
        }
        break;
    }

    if ( node && node->ToText() ) {
        return node->Value();
    }
    return 0;
}